

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluation.c
# Opt level: O1

Expr gensym(pExecutor exec,pContext_conflict defContext,pContext_conflict callContext,Expr *args,
           int argc)

{
  _Bool _Var1;
  int iVar2;
  long value;
  size_t sVar3;
  anon_union_8_8_707b72ea_for_Expr_1 aVar4;
  char *__s;
  ulong unaff_R15;
  Expr EVar5;
  Expr EVar6;
  Expr expr;
  Expr expr_00;
  Expr num;
  Expr value_00;
  char name [7];
  Expr local_58;
  pContext_conflict local_48;
  char local_3f [7];
  anon_union_8_8_707b72ea_for_Expr_1 local_38;
  
  local_48 = defContext;
  if (argc != 0) {
    __s = "gensym: too many arguments";
    goto LAB_001048ba;
  }
  EVar5 = make_atom(exec,"*gensym-counter*");
  aVar4 = EVar5.field_1;
  expr._4_4_ = 0;
  expr.type = EVar5.type;
  expr.field_1.val_atom = aVar4.val_atom;
  _Var1 = is_none(expr);
  if (_Var1) {
LAB_001048aa:
    __s = "gensym: make_atom failed";
    goto LAB_001048ba;
  }
  local_38.val_atom = aVar4.val_atom;
  iVar2 = context_get(local_48,aVar4.val_atom,&local_58);
  if (iVar2 == -1) {
LAB_00104797:
    EVar5 = make_int_one(exec);
    local_58.field_1 = EVar5.field_1;
    local_58.type = EVar5.type;
    expr_00._4_4_ = 0;
    expr_00.type = local_58.type;
    expr_00.field_1.val_atom = local_58.field_1.val_atom;
    _Var1 = is_none(expr_00);
    if (_Var1) {
      __s = "gensym: exec_int_one failed";
      goto LAB_001048ba;
    }
  }
  else {
    EVar5._4_4_ = 0;
    EVar5.type = local_58.type;
    EVar5.field_1.val_atom = local_58.field_1.val_atom;
    _Var1 = is_int(EVar5);
    if (!_Var1) goto LAB_00104797;
  }
  num._4_4_ = 0;
  num.type = local_58.type;
  num.field_1.val_atom = local_58.field_1.val_atom;
  value = exec_int_to_long(exec,num);
  aVar4.val_int = (pLongInt)local_3f;
  sprintf((char *)aVar4.val_int,"#:%ld",value);
  sVar3 = find_atom(exec,(char *)aVar4.val_int);
  if (sVar3 != 0x7fffffff) {
    do {
      if (sVar3 == 0x7ffffffe) {
        EVar5 = make_atom(exec,local_3f);
        aVar4 = EVar5.field_1;
        if (EVar5.type == VT_NONE) goto LAB_001048aa;
        unaff_R15 = (ulong)EVar5.type;
        EVar5 = make_int_from_long(exec,value);
        local_58.field_1 = EVar5.field_1;
        local_58.type = EVar5.type;
        value_00._4_4_ = 0;
        value_00.type = local_58.type;
        value_00.field_1.val_atom = local_58.field_1.val_atom;
        iVar2 = context_set(local_48,local_38.val_atom,value_00);
        if (iVar2 == -1) {
          __s = "gensym: context_bind failed";
          goto LAB_001048ba;
        }
      }
      if (sVar3 == 0x7ffffffe) {
        EVar6._0_8_ = unaff_R15 & 0xffffffff;
        EVar6.field_1.val_atom = aVar4.val_atom;
        return EVar6;
      }
      value = value + 1;
      sprintf(local_3f,"#:%ld",value);
      sVar3 = find_atom(exec,local_3f);
    } while (sVar3 != 0x7fffffff);
  }
  __s = "gensym: find_atom failed";
LAB_001048ba:
  puts(__s);
  exit(1);
}

Assistant:

BUILTIN_FUNC(gensym)
{
    if (argc != 0)
    {
        log("gensym: too many arguments");
        exit(1);
    }
    Expr counter = make_atom(exec, "*gensym-counter*");
    if (is_none(counter))
    {
        log("gensym: make_atom failed");
        exit(1);
    }
    Expr value;
    if (context_get(defContext, counter.val_atom, &value) == MAP_FAILED || !is_int(value))
    {
        value = make_int_one(exec);
        if (is_none(value))
        {
            log("gensym: exec_int_one failed");
            exit(1);
        }
    }
    long n = exec_int_to_long(exec, value);
    for (;; n++)
    {
        char name[7];
        sprintf(name, "#:%ld", n);
        size_t found = find_atom(exec, name);
        if (found == EXPR_ERROR)
        {
            log("gensym: find_atom failed");
            exit(1);
        }
        if (found == EXPR_NOT_FOUND)
        {
            Expr res = make_atom(exec, name);
            if (res.type == VT_NONE)
            {
                log("gensym: make_atom failed");
                exit(1);
            }
            value = make_int_from_long(exec, n);
            if (context_set(defContext, counter.val_atom, value) == MAP_FAILED)
            {
                log("gensym: context_bind failed");
                exit(1);
            }
            return res;
        }
    }
}